

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O2

void __thiscall cubeb_drain_Test::TestBody(cubeb_drain_Test *this)

{
  AssertionResult *pAVar1;
  int iVar2;
  anon_enum_32 *in_RCX;
  anon_enum_32 *actual;
  cubeb_stream **val1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  String *this_01;
  char *pcVar3;
  String *this_02;
  AssertionResult gtest_ar_2;
  int r;
  String local_88;
  cubeb_stream *stream;
  uint64_t position;
  cubeb *ctx;
  AssertionResult gtest_ar;
  AssertHelper local_38;
  
  delay_callback = 0;
  LOCK();
  total_frames_written.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  UNLOCK();
  r = common_init(&ctx,"test_sanity");
  gtest_ar_2._0_8_ = (ulong)(uint)gtest_ar_2._4_4_ << 0x20;
  testing::internal::EqHelper<false>::Compare<int,__0>
            (&gtest_ar.success_,(char *)&r,(int *)&gtest_ar_2,in_RCX);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    iVar2 = 0x256;
LAB_0010bcc6:
    this_02 = &local_88;
    pAVar1 = &gtest_ar;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
               ,iVar2,pcVar3);
    this_01 = (String *)&gtest_ar_2;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar_2.success_ = false;
    gtest_ar_2._1_7_ = 0;
    testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
              ((internal *)&gtest_ar,"ctx","nullptr",&ctx,(void **)&gtest_ar_2);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_2);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      iVar2 = 599;
      goto LAB_0010bcc6;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0xac44000000;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400000001;
    actual = (anon_enum_32 *)0x0;
    r = cubeb_stream_init(ctx,&stream,"test",(cubeb_devid)0x0,(cubeb_stream_params *)0x0,
                          (cubeb_devid)0x0,(cubeb_stream_params *)&gtest_ar,0x113a,
                          test_drain_data_callback,test_drain_state_callback,&dummy);
    local_88.c_str_ = (char *)((ulong)local_88.c_str_._4_4_ << 0x20);
    testing::internal::EqHelper<false>::Compare<int,__0>
              (&gtest_ar_2.success_,(char *)&r,(int *)&local_88,actual);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&local_88);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      this_02 = (String *)&position;
      iVar2 = 0x261;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_2.message_);
      local_88.c_str_ = (char *)0x0;
      val1 = &stream;
      testing::internal::CmpHelperNE<cubeb_stream*,decltype(nullptr)>
                ((internal *)&gtest_ar_2,"stream","nullptr",val1,&local_88.c_str_);
      if (gtest_ar_2.success_ == false) {
        testing::Message::Message((Message *)&local_88);
        if (gtest_ar_2.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
        }
        this_02 = (String *)&position;
        iVar2 = 0x262;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_2.message_);
        r = cubeb_stream_start(stream);
        local_88.c_str_ = (char *)((ulong)local_88.c_str_ & 0xffffffff00000000);
        testing::internal::EqHelper<false>::Compare<int,__0>
                  (&gtest_ar_2.success_,(char *)&r,(int *)&local_88,(anon_enum_32 *)val1);
        if (gtest_ar_2.success_ != false) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_2.message_);
          delay(5000);
          LOCK();
          do_drain.super___atomic_base<int>._M_i = (__atomic_base<int>)1;
          UNLOCK();
          while( true ) {
            r = cubeb_stream_get_position(stream,&position);
            local_88.c_str_ = (char *)((ulong)local_88.c_str_ & 0xffffffff00000000);
            testing::internal::EqHelper<false>::Compare<int,__0>
                      (&gtest_ar_2.success_,(char *)&r,(int *)&local_88,(anon_enum_32 *)val1);
            if (gtest_ar_2.success_ == false) break;
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar_2.message_);
            if (got_drain.super___atomic_base<int>._M_i != 0) {
              r = cubeb_stream_get_position(stream,&position);
              local_88.c_str_ = (char *)((ulong)local_88.c_str_ & 0xffffffff00000000);
              testing::internal::EqHelper<false>::Compare<int,__0>
                        (&gtest_ar_2.success_,(char *)&r,(int *)&local_88,(anon_enum_32 *)val1);
              if (gtest_ar_2.success_ != false) {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar_2.message_);
                gtest_ar_2.message_.ptr_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                this_00 = &gtest_ar_2.message_;
                gtest_ar_2.success_ = got_drain.super___atomic_base<int>._M_i != 0;
                if (got_drain.super___atomic_base<int>._M_i != 0) {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(this_00);
                  cubeb_stream_destroy(stream);
                  cubeb_destroy(ctx);
                  LOCK();
                  UNLOCK();
                  LOCK();
                  UNLOCK();
                  got_drain = (atomic<int>)0x0;
                  do_drain = (atomic<int>)0x0;
                  return;
                }
                this_01 = (String *)&stack0xffffffffffffff98;
                testing::Message::Message((Message *)this_01);
                testing::internal::GetBoolAssertionFailureMessage
                          ((internal *)&local_88,&gtest_ar_2,"got_drain","false","true");
                testing::internal::AssertHelper::AssertHelper
                          (&local_38,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                           ,0x278,local_88.c_str_);
                testing::internal::AssertHelper::operator=(&local_38,(Message *)this_01);
                testing::internal::AssertHelper::~AssertHelper(&local_38);
                testing::internal::String::~String(&local_88);
                goto LAB_0010bd8b;
              }
              testing::Message::Message((Message *)&local_88);
              if (gtest_ar_2.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar3 = "";
              }
              else {
                pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
              }
              this_02 = (String *)&stack0xffffffffffffff98;
              iVar2 = 0x277;
              goto LAB_0010bd6b;
            }
            local_88.c_str_ = (char *)total_frames_written.super___atomic_base<unsigned_long>._M_i;
            val1 = (cubeb_stream **)&position;
            testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                      ((internal *)&gtest_ar_2,"position","total_frames_written.load()",&position,
                       (unsigned_long *)&local_88);
            if (gtest_ar_2.success_ == false) {
              testing::Message::Message((Message *)&local_88);
              if (gtest_ar_2.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar3 = "";
              }
              else {
                pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
              }
              iVar2 = 0x271;
              goto LAB_0010becb;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar_2.message_);
            delay(500);
          }
          testing::Message::Message((Message *)&local_88);
          if (gtest_ar_2.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
          }
          iVar2 = 0x26d;
LAB_0010becb:
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xffffffffffffff98,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                     ,iVar2,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xffffffffffffff98,(Message *)&local_88);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff98);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_88);
          this_00 = &gtest_ar_2.message_;
          goto LAB_0010bd93;
        }
        testing::Message::Message((Message *)&local_88);
        if (gtest_ar_2.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
        }
        this_02 = (String *)&position;
        iVar2 = 0x265;
      }
    }
LAB_0010bd6b:
    pAVar1 = &gtest_ar_2;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
               ,iVar2,pcVar3);
    this_01 = &local_88;
  }
  this_00 = &pAVar1->message_;
  testing::internal::AssertHelper::operator=((AssertHelper *)this_02,(Message *)this_01);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
LAB_0010bd8b:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_01);
LAB_0010bd93:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(this_00);
  return;
}

Assistant:

TEST(cubeb, drain)
{
  int r;
  cubeb * ctx;
  cubeb_stream * stream;
  cubeb_stream_params params;
  uint64_t position;

  delay_callback = 0;
  total_frames_written = 0;

  r = common_init(&ctx, "test_sanity");
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(ctx, nullptr);

  params.format = STREAM_FORMAT;
  params.rate = STREAM_RATE;
  params.channels = STREAM_CHANNELS;
  params.layout = STREAM_LAYOUT;
  params.prefs = CUBEB_STREAM_PREF_NONE;

  r = cubeb_stream_init(ctx, &stream, "test", NULL, NULL, NULL, &params, STREAM_LATENCY,
                        test_drain_data_callback, test_drain_state_callback, &dummy);
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(stream, nullptr);

  r = cubeb_stream_start(stream);
  ASSERT_EQ(r, CUBEB_OK);

  delay(5000);

  do_drain = 1;

  for (;;) {
    r = cubeb_stream_get_position(stream, &position);
    ASSERT_EQ(r, CUBEB_OK);
    if (got_drain) {
      break;
    } else {
      ASSERT_LE(position, total_frames_written.load());
    }
    delay(500);
  }

  r = cubeb_stream_get_position(stream, &position);
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_TRUE(got_drain);

  // Really, we should be able to rely on position reaching our final written frame, but
  // for now let's make sure it doesn't continue beyond that point.
  //ASSERT_LE(position, total_frames_written.load());

  cubeb_stream_destroy(stream);
  cubeb_destroy(ctx);

  got_drain = 0;
  do_drain = 0;
}